

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DynamicProfileInfo.h
# Opt level: O0

bool __thiscall Js::BufferReader::Read<Js::DynamicProfileInfo::Bits>(BufferReader *this,Bits *data)

{
  char *pcVar1;
  code *pcVar2;
  char cVar3;
  char cVar4;
  char cVar5;
  bool bVar6;
  undefined4 *puVar7;
  Bits *data_local;
  BufferReader *this_local;
  
  if (this->lengthLeft < 5) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar7 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar7 = 1;
    bVar6 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/DynamicProfileInfo.h"
                                ,0x3bc,"(false)","false");
    if (!bVar6) {
      pcVar2 = (code *)invalidInstructionException();
      (*pcVar2)();
    }
    puVar7 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar7 = 0;
    this_local._7_1_ = false;
  }
  else {
    pcVar1 = this->current;
    cVar3 = pcVar1[1];
    cVar4 = pcVar1[2];
    cVar5 = pcVar1[3];
    data->field_0x0 = pcVar1[0];
    data->field_0x1 = cVar3;
    data->field_0x2 = cVar4;
    data->field_0x3 = cVar5;
    data->field_0x4 = pcVar1[4];
    this->current = this->current + 5;
    this->lengthLeft = this->lengthLeft - 5;
    this_local._7_1_ = true;
  }
  return this_local._7_1_;
}

Assistant:

bool Read(T * data)
        {
            if (lengthLeft < sizeof(T))
            {
                AssertOrFailFast(false);
                return false;
            }
            *data = *(T *)current;
            current += sizeof(T);
            lengthLeft -= sizeof(T);
            return true;
        }